

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O2

bool google::protobuf::internal::WireFormatLite::
     ReadRepeatedPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
               (int param_1,uint32 tag,CodedInputStream *input,RepeatedField<unsigned_long> *values)

{
  bool bVar1;
  byte *pbVar2;
  int iVar3;
  unsigned_long value;
  uint64 local_38;
  
  bVar1 = io::CodedInputStream::ReadVarint64(input,&local_38);
  if (bVar1) {
    RepeatedField<unsigned_long>::Add(values,&local_38);
    for (iVar3 = values->total_size_ - values->current_size_; bVar1 = true, 0 < iVar3;
        iVar3 = iVar3 + -1) {
      if (tag < 0x80) {
        pbVar2 = input->buffer_;
        if (input->buffer_end_ <= pbVar2) {
          return true;
        }
        if (*pbVar2 != tag) {
          return true;
        }
        pbVar2 = pbVar2 + 1;
      }
      else {
        if (0x3fff < tag) {
          return true;
        }
        pbVar2 = input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)pbVar2 < 2) {
          return true;
        }
        if ((tag & 0xff | 0x80) != (uint)*pbVar2) {
          return true;
        }
        if (tag >> 7 != (uint)pbVar2[1]) {
          return true;
        }
        pbVar2 = pbVar2 + 2;
      }
      input->buffer_ = pbVar2;
      bVar1 = io::CodedInputStream::ReadVarint64(input,&local_38);
      if (!bVar1) goto LAB_0053f9a0;
      RepeatedField<unsigned_long>::AddAlreadyReserved(values,&local_38);
    }
  }
  else {
LAB_0053f9a0:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

inline bool WireFormatLite::ReadRepeatedPrimitive(
    int,  // tag_size, unused.
    uint32 tag,
    io::CodedInputStream* input,
    RepeatedField<CType>* values) {
  CType value;
  if (!ReadPrimitive<CType, DeclaredType>(input, &value)) return false;
  values->Add(value);
  int elements_already_reserved = values->Capacity() - values->size();
  while (elements_already_reserved > 0 && input->ExpectTag(tag)) {
    if (!ReadPrimitive<CType, DeclaredType>(input, &value)) return false;
    values->AddAlreadyReserved(value);
    elements_already_reserved--;
  }
  return true;
}